

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O3

void __thiscall raft_functional_common::TestMgr::TestMgr(TestMgr *this,int srv_id,string *endpoint)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t *psVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  srv_config *psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  uint uVar6;
  long *plVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Node *p_Var9;
  uint uVar10;
  size_type *psVar11;
  ulong uVar12;
  uint __val;
  cluster_config *__tmp;
  element_type *peVar13;
  uint __len;
  bool local_b2;
  undefined1 local_b1;
  int local_b0;
  int srv_id_local;
  srv_config *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_a0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_54;
  string __str;
  
  (this->super_state_mgr)._vptr_state_mgr = (_func_int **)&PTR__TestMgr_0061a9e8;
  this->myId = srv_id;
  local_80 = &this->myEndpoint;
  local_88 = &(this->myEndpoint).field_2;
  (this->myEndpoint)._M_dataplus._M_p = (pointer)local_88;
  pcVar2 = (endpoint->_M_dataplus)._M_p;
  srv_id_local = srv_id;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar2,pcVar2 + endpoint->_M_string_length);
  (this->curLogStore).super___shared_ptr<nuraft::inmem_log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  this_00 = &(this->curLogStore).
             super___shared_ptr<nuraft::inmem_log_store,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::inmem_log_store,std::allocator<nuraft::inmem_log_store>>
            (this_00,(inmem_log_store **)&this->curLogStore,
             (allocator<nuraft::inmem_log_store> *)&local_78);
  (this->savedState).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->savedState).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->savedConfig).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->savedConfig).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mySrvConfig).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mySrvConfig).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b0 = 1;
  __val = -srv_id;
  if (0 < srv_id) {
    __val = srv_id;
  }
  __len = 1;
  if (9 < __val) {
    uVar12 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar10 = (uint)uVar12;
      if (uVar10 < 100) {
        __len = __len - 2;
        goto LAB_001cf0db;
      }
      if (uVar10 < 1000) {
        __len = __len - 1;
        goto LAB_001cf0db;
      }
      if (uVar10 < 10000) goto LAB_001cf0db;
      uVar12 = uVar12 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar10);
    __len = __len + 1;
  }
LAB_001cf0db:
  local_90 = this_00;
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str,(char)__len - (char)(srv_id >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (__str._M_dataplus._M_p + ((uint)srv_id >> 0x1f),__len,__val);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x4bc387);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_78.field_2._M_allocated_capacity = *psVar11;
    local_78.field_2._8_8_ = plVar7[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar11;
    local_78._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_78._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b2 = false;
  local_54 = 0x32;
  local_a8 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::srv_config,std::allocator<nuraft::srv_config>,int&,int,std::__cxx11::string_const&,std::__cxx11::string,bool,int>
            (a_Stack_a0,&local_a8,(allocator<nuraft::srv_config> *)&local_b1,&srv_id_local,&local_b0
             ,endpoint,&local_78,&local_b2,&local_54);
  _Var5._M_pi = a_Stack_a0[0]._M_pi;
  psVar4 = local_a8;
  local_a8 = (srv_config *)0x0;
  a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->mySrvConfig).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->mySrvConfig).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       psVar4;
  (this->mySrvConfig).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var5._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (a_Stack_a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_a0[0]._M_pi);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p);
  }
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0061ab08;
  peVar13 = (element_type *)(p_Var8 + 1);
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[1]._M_use_count = 0;
  p_Var8[1]._M_weak_count = 0;
  *(undefined1 *)&p_Var8[2]._vptr__Sp_counted_base = 0;
  *(_Atomic_word **)&p_Var8[2]._M_use_count = &p_Var8[3]._M_use_count;
  p_Var8[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&p_Var8[3]._M_use_count = 0;
  p_Var8[5]._vptr__Sp_counted_base = (_func_int **)&p_Var8[4]._M_use_count;
  *(_Atomic_word **)&p_Var8[4]._M_use_count = &p_Var8[4]._M_use_count;
  p_Var8[5]._M_use_count = 0;
  p_Var8[5]._M_weak_count = 0;
  (this->savedConfig).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar13;
  p_Var3 = (this->savedConfig).
           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->savedConfig).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var8;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    peVar13 = (this->savedConfig).
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  p_Var9 = std::__cxx11::
           list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
           ::_M_create_node<std::shared_ptr<nuraft::srv_config>const&>
                     ((list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                       *)&peVar13->servers_,&this->mySrvConfig);
  std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
  psVar1 = &(peVar13->servers_).
            super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

TestMgr(int srv_id,
            const std::string& endpoint)
        : myId(srv_id)
        , myEndpoint(endpoint)
        , curLogStore( cs_new<inmem_log_store>() )
    {
        mySrvConfig = cs_new<srv_config>
                      ( srv_id,
                        1,
                        endpoint,
                        "server " + std::to_string(srv_id),
                        false,
                        50 );

        savedConfig = cs_new<cluster_config>();
        savedConfig->get_servers().push_back(mySrvConfig);
    }